

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void ly_vlog(ly_ctx *ctx,LY_ECODE ecode,LY_VLOG_ELEM elem_type,void *elem,...)

{
  char in_AL;
  ly_err_item *plVar1;
  LY_VECODE vecode;
  char *pcVar2;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [32];
  char *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list ap;
  char *path;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = (void *)0x0;
  if ((ecode == LYE_PATH) && (path_flag == 0)) {
    return;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((elem_type != LY_VLOG_NONE) && (path_flag != 0)) {
    if (elem_type == LY_VLOG_PREV) {
      plVar1 = ly_err_first(ctx);
      if ((plVar1 == (ly_err_item *)0x0) || (pcVar2 = plVar1->prev->path, pcVar2 == (char *)0x0))
      goto LAB_0010fb2f;
    }
    else {
      if (elem != (void *)0x0) {
        ly_vlog_build_path(elem_type,elem,(char **)&ap[0].reg_save_area,0,0);
        goto LAB_0010fb2f;
      }
      pcVar2 = "/";
    }
    ap[0].reg_save_area = strdup(pcVar2);
  }
LAB_0010fb2f:
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_38._0_4_ = 0x20;
  local_38._4_4_ = 0x30;
  if (ecode == LYE_PATH) {
    if (ap[0].reg_save_area == (void *)0x0) {
      __assert_fail("path",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                    ,0x371,
                    "void ly_vlog(const struct ly_ctx *, LY_ECODE, enum LY_VLOG_ELEM, const void *, ...)"
                   );
    }
    vecode = LYVE_SUCCESS;
    pcVar2 = (char *)0x0;
  }
  else if (ecode == LYE_SPEC) {
    local_38._0_4_ = 0x28;
    local_38._4_4_ = 0x30;
    vecode = LYVE_SUCCESS;
    pcVar2 = local_c8;
  }
  else {
    vecode = ecode2vecode[ecode];
    pcVar2 = ly_errs[ecode];
  }
  log_vprintf(ctx,LY_LLERR,LY_EVALID,vecode,(char *)ap[0].reg_save_area,pcVar2,
              (__va_list_tag *)local_38);
  return;
}

Assistant:

void
ly_vlog(const struct ly_ctx *ctx, LY_ECODE ecode, enum LY_VLOG_ELEM elem_type, const void *elem, ...)
{
    va_list ap;
    const char *fmt;
    char* path = NULL;
    const struct ly_err_item *first;

    if ((ecode == LYE_PATH) && !path_flag) {
        return;
    }

    if (path_flag && (elem_type != LY_VLOG_NONE)) {
        if (elem_type == LY_VLOG_PREV) {
            /* use previous path */
            first = ly_err_first(ctx);
            if (first && first->prev->path) {
                path = strdup(first->prev->path);
            }
        } else {
            /* print path */
            if (!elem) {
                /* top-level */
                path = strdup("/");
            } else {
                ly_vlog_build_path(elem_type, elem, &path, 0, 0);
            }
        }
    }

    va_start(ap, elem);
    /* path is spent and should not be freed! */
    switch (ecode) {
    case LYE_SPEC:
        fmt = va_arg(ap, char *);
        log_vprintf(ctx, LY_LLERR, LY_EVALID, LYVE_SUCCESS, path, fmt, ap);
        break;
    case LYE_PATH:
        assert(path);
        log_vprintf(ctx, LY_LLERR, LY_EVALID, LYVE_SUCCESS, path, NULL, ap);
        break;
    default:
        log_vprintf(ctx, LY_LLERR, LY_EVALID, ecode2vecode[ecode], path, ly_errs[ecode], ap);
        break;
    }
    va_end(ap);
}